

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::InternalAlloc(PF_BufferMgr *this,int *slot)

{
  RC RVar1;
  RC local_24;
  RC rc;
  int *slot_local;
  PF_BufferMgr *this_local;
  
  if (this->free == -1) {
    *slot = this->last;
    while ((*slot != -1 && (this->bufTable[*slot].pinCount != 0))) {
      *slot = this->bufTable[*slot].prev;
    }
    if (*slot == -1) {
      return -2;
    }
    if (this->bufTable[*slot].bDirty != 0) {
      RVar1 = WritePage(this,this->bufTable[*slot].fd,this->bufTable[*slot].pageNum,
                        this->bufTable[*slot].pData);
      if (RVar1 != 0) {
        return RVar1;
      }
      this->bufTable[*slot].bDirty = 0;
    }
    local_24 = PF_HashTable::Delete
                         (&this->hashTable,this->bufTable[*slot].fd,this->bufTable[*slot].pageNum);
    if ((local_24 != 0) || (local_24 = Unlink(this,*slot), local_24 != 0)) {
      return local_24;
    }
  }
  else {
    *slot = this->free;
    this->free = this->bufTable[*slot].next;
  }
  this_local._4_4_ = LinkHead(this,*slot);
  if (this_local._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC PF_BufferMgr::InternalAlloc(int &slot)
{
   RC  rc;       // return code

   // If the free list is not empty, choose a slot from the free list
   if (free != INVALID_SLOT) {
      slot = free;
      free = bufTable[slot].next;
   }
   else {

      // Choose the least-recently used page that is unpinned
      for (slot = last; slot != INVALID_SLOT; slot = bufTable[slot].prev) {
         if (bufTable[slot].pinCount == 0)
            break;
      }

      // Return error if all buffers were pinned
      if (slot == INVALID_SLOT)
         return (PF_NOBUF);

      // Write out the page if it is dirty
      if (bufTable[slot].bDirty) {
         if ((rc = WritePage(bufTable[slot].fd, bufTable[slot].pageNum,
               bufTable[slot].pData)))
            return (rc);

         bufTable[slot].bDirty = FALSE;
      }

      // Remove page from the hash table and slot from the used buffer list
      if ((rc = hashTable.Delete(bufTable[slot].fd, bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)))
         return (rc);
   }

   // Link slot at the head of the used list
   if ((rc = LinkHead(slot)))
      return (rc);

   // Return ok
   return (0);
}